

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void var_new(LexState *ls,BCReg n,GCstr *name)

{
  uint uVar1;
  FuncState *fs;
  VarInfo *pVVar2;
  uint uVar3;
  
  fs = ls->fs;
  uVar3 = fs->nactvar + n;
  if (199 < uVar3) {
    err_limit(fs,200,"local variables");
  }
  uVar1 = ls->vtop;
  if (uVar1 < ls->sizevstack) {
    pVVar2 = ls->vstack;
  }
  else {
    if (0xff87 < ls->sizevstack) {
      lj_lex_error(ls,0,LJ_ERR_XLIMC,0xff88);
    }
    pVVar2 = (VarInfo *)lj_mem_grow(ls->L,ls->vstack,&ls->sizevstack,0xff88,0x18);
    ls->vstack = pVVar2;
    uVar3 = n + fs->nactvar;
  }
  pVVar2[uVar1].name.gcptr64 = (uint64_t)name;
  fs->varmap[uVar3] = (VarIndex)uVar1;
  ls->vtop = uVar1 + 1;
  return;
}

Assistant:

static void var_new(LexState *ls, BCReg n, GCstr *name)
{
  FuncState *fs = ls->fs;
  MSize vtop = ls->vtop;
  checklimit(fs, fs->nactvar+n, LJ_MAX_LOCVAR, "local variables");
  if (LJ_UNLIKELY(vtop >= ls->sizevstack)) {
    if (ls->sizevstack >= LJ_MAX_VSTACK)
      lj_lex_error(ls, 0, LJ_ERR_XLIMC, LJ_MAX_VSTACK);
    lj_mem_growvec(ls->L, ls->vstack, ls->sizevstack, LJ_MAX_VSTACK, VarInfo);
  }
  lj_assertFS((uintptr_t)name < VARNAME__MAX ||
	      lj_tab_getstr(fs->kt, name) != NULL,
	      "unanchored variable name");
  /* NOBARRIER: name is anchored in fs->kt and ls->vstack is not a GCobj. */
  setgcref(ls->vstack[vtop].name, obj2gco(name));
  fs->varmap[fs->nactvar+n] = (uint16_t)vtop;
  ls->vtop = vtop+1;
}